

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAds::testAdsReadStateReqEx(TestAds *this,string *param_1)

{
  long lVar1;
  bool condition;
  test_root local_198;
  test_root local_178;
  test_root local_158;
  test_root local_138;
  AmsNetId local_118 [6];
  undefined2 local_112;
  AmsAddr unknown;
  test_root local_f0;
  test_root local_d0;
  test_root local_b0;
  test_root local_90;
  test_root local_70;
  ushort local_50;
  ushort local_4e [3];
  uint16_t devState;
  uint16_t adsState;
  test_root local_40;
  long local_20;
  long port;
  string *param_1_local;
  TestAds *this_local;
  
  port = (long)param_1;
  param_1_local = (string *)this;
  local_20 = AdsPortOpenEx();
  condition = local_20 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_40);
  fructose::test_root::test_assert
            ((test_root *)this,condition,(string *)&local_40,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1bc);
  std::__cxx11::string::~string((string *)&local_40);
  lVar1 = AdsSyncReadStateReqEx(local_20,(AmsAddr *)&server,local_4e,&local_50);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_70,
             "0 == AdsSyncReadStateReqEx(port, &server, &adsState, &devState)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c0);
  std::__cxx11::string::~string((string *)&local_70);
  fructose::test_root::get_test_name_abi_cxx11_(&local_90);
  fructose::test_root::test_assert
            ((test_root *)this,local_4e[0] == 5,(string *)&local_90,"ADSSTATE_RUN == adsState",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c1);
  std::__cxx11::string::~string((string *)&local_90);
  fructose::test_root::get_test_name_abi_cxx11_(&local_b0);
  fructose::test_root::test_assert
            ((test_root *)this,local_50 == 0,(string *)&local_b0,"0 == devState",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c2);
  std::__cxx11::string::~string((string *)&local_b0);
  lVar1 = AdsSyncReadStateReqEx(local_20,(AmsAddr *)&serverBadPort,local_4e,&local_50);
  fructose::test_root::get_test_name_abi_cxx11_(&local_d0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 6,(string *)&local_d0,
             "GLOBALERR_TARGET_PORT == AdsSyncReadStateReqEx(port, &serverBadPort, &adsState, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1c5);
  std::__cxx11::string::~string((string *)&local_d0);
  lVar1 = AdsSyncReadStateReqEx(0,(AmsAddr *)&server,local_4e,&local_50);
  fructose::test_root::get_test_name_abi_cxx11_(&local_f0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x748,(string *)&local_f0,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadStateReqEx(0, &server, &adsState, &devState)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c8);
  std::__cxx11::string::~string((string *)&local_f0);
  lVar1 = AdsSyncReadStateReqEx(local_20,(AmsAddr *)0x0,local_4e,&local_50);
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&unknown);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x749,(string *)&unknown,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadStateReqEx(port, nullptr, &adsState, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1cb);
  std::__cxx11::string::~string((string *)&unknown);
  AmsNetId::AmsNetId(local_118,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_112 = 0x353;
  lVar1 = AdsSyncReadStateReqEx(local_20,(AmsAddr *)local_118,local_4e,&local_50);
  fructose::test_root::get_test_name_abi_cxx11_(&local_138);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 7,(string *)&local_138,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadStateReqEx(port, &unknown, &adsState, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1cf);
  std::__cxx11::string::~string((string *)&local_138);
  lVar1 = AdsSyncReadStateReqEx(local_20,(AmsAddr *)&server,(ushort *)0x0,&local_50);
  fructose::test_root::get_test_name_abi_cxx11_(&local_158);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_158,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, nullptr, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1d2);
  std::__cxx11::string::~string((string *)&local_158);
  lVar1 = AdsSyncReadStateReqEx(local_20,(AmsAddr *)&server,local_4e,(ushort *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_178);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_178,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, &adsState, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1d3);
  std::__cxx11::string::~string((string *)&local_178);
  lVar1 = AdsPortCloseEx(local_20);
  fructose::test_root::get_test_name_abi_cxx11_(&local_198);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_198,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1d4);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void testAdsReadStateReqEx(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint16_t adsState;
        uint16_t devState;
        fructose_assert(0 == AdsSyncReadStateReqEx(port, &server, &adsState, &devState));
        fructose_assert(ADSSTATE_RUN == adsState);
        fructose_assert(0 == devState);

        // provide bad server port
        fructose_assert(GLOBALERR_TARGET_PORT == AdsSyncReadStateReqEx(port, &serverBadPort, &adsState, &devState));

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadStateReqEx(0, &server, &adsState, &devState));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR == AdsSyncReadStateReqEx(port, nullptr, &adsState, &devState));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE == AdsSyncReadStateReqEx(port, &unknown, &adsState, &devState));

        // provide nullptr to adsState/devState
        fructose_assert(ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, nullptr, &devState));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, &adsState, nullptr));
        fructose_assert(0 == AdsPortCloseEx(port));
    }